

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubkey.cpp
# Opt level: O2

CPubKey * __thiscall EllSwiftPubKey::Decode(CPubKey *__return_storage_ptr__,EllSwiftPubKey *this)

{
  long in_FS_OFFSET;
  size_t sz;
  array<unsigned_char,_33UL> vch_bytes;
  secp256k1_pubkey pubkey;
  size_t local_98;
  uchar local_89 [33];
  secp256k1_pubkey local_68;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  secp256k1_ellswift_decode(secp256k1_context_static,&local_68,(uchar *)this);
  local_98 = 0x21;
  secp256k1_ec_pubkey_serialize(secp256k1_context_static,local_89,&local_98,&local_68,0x102);
  if (local_98 != 0x21) {
    __assert_fail("sz == vch_bytes.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/pubkey.cpp"
                  ,0x170,"CPubKey EllSwiftPubKey::Decode() const");
  }
  CPubKey::Set<unsigned_char*>(__return_storage_ptr__,local_89,local_68.data);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

CPubKey EllSwiftPubKey::Decode() const
{
    secp256k1_pubkey pubkey;
    secp256k1_ellswift_decode(secp256k1_context_static, &pubkey, UCharCast(m_pubkey.data()));

    size_t sz = CPubKey::COMPRESSED_SIZE;
    std::array<uint8_t, CPubKey::COMPRESSED_SIZE> vch_bytes;

    secp256k1_ec_pubkey_serialize(secp256k1_context_static, vch_bytes.data(), &sz, &pubkey, SECP256K1_EC_COMPRESSED);
    assert(sz == vch_bytes.size());

    return CPubKey{vch_bytes.begin(), vch_bytes.end()};
}